

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>>::
emplaceValue<QStyleSheetStyleCaches::Tampered<QPalette>const&>
          (Node<QWidget_const*,QStyleSheetStyleCaches::Tampered<QPalette>> *this,
          Tampered<QPalette> *args)

{
  ColorGroup CVar1;
  QPalettePrivate *pQVar2;
  long in_FS_OFFSET;
  QPalette local_38;
  ResolveMask local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QPalette::QPalette(&local_38,&args->oldWidgetValue);
  local_28 = args->resolveMask;
  CVar1 = *(ColorGroup *)(this + 0x10);
  *(ColorGroup *)(this + 0x10) = local_38.currentGroup;
  pQVar2 = *(QPalettePrivate **)(this + 8);
  *(QPalettePrivate **)(this + 8) = local_38.d;
  *(ResolveMask *)(this + 0x18) = local_28;
  local_38.d = pQVar2;
  local_38.currentGroup = CVar1;
  QPalette::~QPalette(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }